

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_Property_Test::Body(iu_Matcher_x_iutest_x_Property_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  string *in_RCX;
  X **v;
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  *expected;
  map<int,_(anonymous_namespace)::X,_std::less<int>,_std::allocator<std::pair<const_int,_(anonymous_namespace)::X>_>_>
  *v_00;
  AssertionResult *in_R8;
  string local_7c8;
  string local_7a8;
  AssertionHelper local_788;
  Fixed local_758;
  int local_5cc;
  GeMatcher<int> local_5c8;
  code *local_5b8;
  undefined8 local_5b0;
  PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>
  local_5a8;
  int local_584;
  LeMatcher<int> local_580;
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  local_570;
  EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>_>
  local_538;
  undefined1 local_4f8 [8];
  AssertionResult iutest_ar_2;
  string local_4c8;
  string local_4a8;
  AssertionHelper local_488;
  Fixed local_458;
  X *local_2d0;
  undefined4 local_2c4;
  code *local_2c0;
  undefined8 local_2b8;
  PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_int> local_2b0;
  undefined1 local_298 [8];
  AssertionResult iutest_ar_1;
  string local_250;
  AssertionHelper local_230;
  Fixed local_200;
  undefined4 local_64;
  code *local_60;
  undefined8 local_58;
  PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_int> local_50;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_Property_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_60 = anon_unknown.dwarf_5a076::X::GetA;
  local_58 = 0;
  local_64 = 1;
  iutest::matchers::Property<int((anonymous_namespace)::X::*)()const,int>
            (&local_50,(matchers *)&local_60,(offset_in_X_to_subr *)&local_64,(int *)in_RCX);
  iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
            ((AssertionResult *)local_38,
             (PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)&local_50,
             (X *)&(anonymous_namespace)::gx);
  iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_int>::~PropertyMatcher
            (&local_50);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    iutest::PrintToString<(anonymous_namespace)::X>
              ((string *)&iutest_ar_1.m_result,(X *)&(anonymous_namespace)::gx);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_250,pdVar2,"Property(&X::GetA, 1)",local_38,in_R8);
    in_RCX = &local_250;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x170,in_RCX,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_200);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2c0 = anon_unknown.dwarf_5a076::X::GetA;
  local_2b8 = 0;
  local_2c4 = 1;
  iutest::matchers::Property<int((anonymous_namespace)::X::*)()const,int>
            (&local_2b0,(matchers *)&local_2c0,(offset_in_X_to_subr *)&local_2c4,(int *)in_RCX);
  local_2d0 = (X *)&(anonymous_namespace)::gx;
  iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
            ((AssertionResult *)local_298,
             (PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)&local_2b0,&local_2d0);
  iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_int>::~PropertyMatcher
            (&local_2b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    memset(&local_458,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_458);
    iutest_ar_2._32_8_ = &(anonymous_namespace)::gx;
    iutest::PrintToString<(anonymous_namespace)::X*>(&local_4c8,(iutest *)&iutest_ar_2.m_result,v);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_4a8,pdVar2,"Property(&X::GetA, 1)",local_298,in_R8);
    in_RCX = &local_4a8;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x171,in_RCX,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_488,&local_458);
    iutest::AssertionHelper::~AssertionHelper(&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_458);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  iutest::detail::AlwaysZero();
  local_584 = 10;
  iutest::matchers::Le<int>((matchers *)&local_580,&local_584);
  local_5b8 = anon_unknown.dwarf_5a076::X::GetA;
  local_5b0 = 0;
  local_5cc = 0;
  iutest::matchers::Ge<int>((matchers *)&local_5c8,&local_5cc);
  iutest::matchers::Property<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>
            (&local_5a8,(matchers *)&local_5b8,(offset_in_X_to_subr *)&local_5c8,
             (GeMatcher<int> *)in_RCX);
  iutest::matchers::
  Pair<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>
            (&local_570,(matchers *)&local_580,(LeMatcher<int> *)&local_5a8,
             (PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>
              *)in_RCX);
  iutest::matchers::
  Each<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>>
            (&local_538,(matchers *)&local_570,expected);
  iutest::detail::
  EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>>
  ::operator()((AssertionResult *)local_4f8,
               (EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>>
                *)&local_538,
               (map<int,_(anonymous_namespace)::X,_std::less<int>,_std::allocator<std::pair<const_int,_(anonymous_namespace)::X>_>_>
                *)(anonymous_namespace)::mx);
  iutest::detail::
  EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>_>
  ::~EachMatcher(&local_538);
  iutest::detail::
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  ::~PairMatcher(&local_570);
  iutest::detail::
  PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>::
  ~PropertyMatcher(&local_5a8);
  iutest::detail::GeMatcher<int>::~GeMatcher(&local_5c8);
  iutest::detail::LeMatcher<int>::~LeMatcher(&local_580);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    memset(&local_758,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_758);
    iutest::
    PrintToString<std::map<int,(anonymous_namespace)::X,std::less<int>,std::allocator<std::pair<int_const,(anonymous_namespace)::X>>>>
              (&local_7c8,(iutest *)(anonymous_namespace)::mx,v_00);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_7a8,pdVar2,"Each(Pair(Le(10), Property(&X::GetA, Ge(0))))",local_4f8,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x173,&local_7a8,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_788,&local_758);
    iutest::AssertionHelper::~AssertionHelper(&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_7c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_758);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  return;
}

Assistant:

IUTEST(Matcher, Property)
{
    IUTEST_EXPECT_THAT( gx, Property(&X::GetA, 1));
    IUTEST_EXPECT_THAT(&gx, Property(&X::GetA, 1));
#if IUTEST_HAS_MATCHER_EACH
    IUTEST_EXPECT_THAT( mx, Each(Pair(Le(10), Property(&X::GetA, Ge(0)))));
#endif
}